

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::bindSelector
          (Compilation *compilation,Expression *value,ElementSelectSyntax *syntax,
          ASTContext *context)

{
  SourceLocation syntax_00;
  Diagnostic *this;
  InvalidExpression *pIVar1;
  Expression *pEVar2;
  SourceRange SVar3;
  SourceRange fullRange;
  SourceRange fullRange_00;
  ASTContext *in_stack_00000008;
  Expression *local_30;
  
  pEVar2 = (Expression *)syntax->selector;
  if (pEVar2 == (Expression *)0x0) {
    SVar3 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x10001,SVar3);
  }
  else {
    if (value->kind != RangeSelect) {
      syntax_00 = (value->sourceRange).startLoc;
      SVar3 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      if (pEVar2->kind == (Dist|Call)) {
        fullRange.endLoc = (SourceLocation)context;
        fullRange.startLoc = SVar3.endLoc;
        pEVar2 = ElementSelectExpression::fromSyntax
                           ((ElementSelectExpression *)compilation,(Compilation *)value,
                            (Expression *)pEVar2->syntax,(ExpressionSyntax *)syntax_00,fullRange,
                            in_stack_00000008);
        return pEVar2;
      }
      fullRange_00.endLoc = (SourceLocation)context;
      fullRange_00.startLoc = SVar3.endLoc;
      pEVar2 = RangeSelectExpression::fromSyntax
                         ((RangeSelectExpression *)compilation,(Compilation *)value,pEVar2,
                          (RangeSelectSyntax *)syntax_00,fullRange_00,in_stack_00000008);
      return pEVar2;
    }
    SVar3 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    this = ASTContext::addDiag(context,(DiagCode)0x940007,SVar3);
    Diagnostic::operator<<(this,value->sourceRange);
  }
  local_30 = (Expression *)0x0;
  pIVar1 = BumpAllocator::
           emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                     (&compilation->super_BumpAllocator,&local_30,compilation->errorType);
  return &pIVar1->super_Expression;
}

Assistant:

Expression& Expression::bindSelector(Compilation& compilation, Expression& value,
                                     const ElementSelectSyntax& syntax, const ASTContext& context) {
    const SelectorSyntax* selector = syntax.selector;
    if (!selector) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (value.kind == ExpressionKind::RangeSelect) {
        context.addDiag(diag::SelectAfterRangeSelect, syntax.sourceRange()) << value.sourceRange;
        return badExpr(compilation, nullptr);
    }

    // The full source range of the expression includes the value and the selector syntax.
    SourceRange fullRange = {value.sourceRange.start(), syntax.sourceRange().end()};

    switch (selector->kind) {
        case SyntaxKind::BitSelect:
            return ElementSelectExpression::fromSyntax(compilation, value,
                                                       *selector->as<BitSelectSyntax>().expr,
                                                       fullRange, context);
        case SyntaxKind::SimpleRangeSelect:
        case SyntaxKind::AscendingRangeSelect:
        case SyntaxKind::DescendingRangeSelect:
            return RangeSelectExpression::fromSyntax(compilation, value,
                                                     selector->as<RangeSelectSyntax>(), fullRange,
                                                     context);
        default:
            SLANG_UNREACHABLE;
    }
}